

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  AABBNodeMB4D *node1;
  ulong uVar10;
  long lVar11;
  NodeRef *pNVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  Primitive *prim;
  int iVar18;
  ulong unaff_R14;
  size_t mask;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined4 uVar22;
  undefined8 uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      pNVar12 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx((undefined1  [16])aVar2,auVar20);
      auVar27._8_4_ = 0x219392ef;
      auVar27._0_8_ = 0x219392ef219392ef;
      auVar27._12_4_ = 0x219392ef;
      auVar20 = vcmpps_avx(auVar20,auVar27,1);
      auVar20 = vblendvps_avx((undefined1  [16])aVar2,auVar27,auVar20);
      auVar27 = vrcpps_avx(auVar20);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = &DAT_3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar20 = vfnmadd231ps_fma(auVar28,auVar27,auVar20);
      auVar8 = vfmadd132ps_fma(auVar20,auVar27,auVar27);
      fVar26 = auVar8._0_4_;
      auVar33._4_4_ = fVar26;
      auVar33._0_4_ = fVar26;
      auVar33._8_4_ = fVar26;
      auVar33._12_4_ = fVar26;
      auVar33._16_4_ = fVar26;
      auVar33._20_4_ = fVar26;
      auVar33._24_4_ = fVar26;
      auVar33._28_4_ = fVar26;
      auVar20 = vmovshdup_avx(auVar8);
      uVar23 = auVar20._0_8_;
      auVar34._8_8_ = uVar23;
      auVar34._0_8_ = uVar23;
      auVar34._16_8_ = uVar23;
      auVar34._24_8_ = uVar23;
      auVar28 = vshufpd_avx(auVar8,auVar8,1);
      auVar27 = vshufps_avx(auVar8,auVar8,0xaa);
      uVar23 = auVar27._0_8_;
      auVar35._8_8_ = uVar23;
      auVar35._0_8_ = uVar23;
      auVar35._16_8_ = uVar23;
      auVar35._24_8_ = uVar23;
      auVar29._0_4_ = fVar26 * (ray->org).field_0.m128[0];
      auVar29._4_4_ = auVar8._4_4_ * (ray->org).field_0.m128[1];
      auVar29._8_4_ = auVar8._8_4_ * (ray->org).field_0.m128[2];
      auVar29._12_4_ = auVar8._12_4_ * (ray->org).field_0.m128[3];
      auVar27 = vmovshdup_avx(auVar29);
      auVar8 = vshufps_avx(auVar29,auVar29,0xaa);
      uVar13 = (ulong)(fVar26 < 0.0) * 0x20;
      uVar14 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x40;
      uVar15 = (ulong)(auVar28._0_4_ < 0.0) << 5 | 0x80;
      uVar10 = CONCAT44(auVar29._0_4_,auVar29._0_4_);
      auVar31._0_8_ = uVar10 ^ 0x8000000080000000;
      auVar31._8_4_ = -auVar29._0_4_;
      auVar31._12_4_ = -auVar29._0_4_;
      auVar31._16_4_ = -auVar29._0_4_;
      auVar31._20_4_ = -auVar29._0_4_;
      auVar31._24_4_ = -auVar29._0_4_;
      auVar31._28_4_ = -auVar29._0_4_;
      uVar24 = auVar27._0_4_;
      uVar25 = auVar27._4_4_;
      auVar32._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = uVar24 ^ 0x80000000;
      auVar32._12_4_ = uVar25 ^ 0x80000000;
      auVar32._16_4_ = uVar24 ^ 0x80000000;
      auVar32._20_4_ = uVar25 ^ 0x80000000;
      auVar32._24_4_ = uVar24 ^ 0x80000000;
      auVar32._28_4_ = uVar25 ^ 0x80000000;
      uVar24 = auVar8._0_4_;
      uVar25 = auVar8._4_4_;
      auVar30._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      auVar30._8_4_ = uVar24 ^ 0x80000000;
      auVar30._12_4_ = uVar25 ^ 0x80000000;
      auVar30._16_4_ = uVar24 ^ 0x80000000;
      auVar30._20_4_ = uVar25 ^ 0x80000000;
      auVar30._24_4_ = uVar24 ^ 0x80000000;
      auVar30._28_4_ = uVar25 ^ 0x80000000;
      uVar22 = auVar3._0_4_;
      auVar36._4_4_ = uVar22;
      auVar36._0_4_ = uVar22;
      auVar36._8_4_ = uVar22;
      auVar36._12_4_ = uVar22;
      auVar36._16_4_ = uVar22;
      auVar36._20_4_ = uVar22;
      auVar36._24_4_ = uVar22;
      auVar36._28_4_ = uVar22;
      auVar37._4_4_ = fVar1;
      auVar37._0_4_ = fVar1;
      auVar37._8_4_ = fVar1;
      auVar37._12_4_ = fVar1;
      auVar37._16_4_ = fVar1;
      auVar37._20_4_ = fVar1;
      auVar37._24_4_ = fVar1;
      auVar37._28_4_ = fVar1;
      do {
        if (pNVar12 == stack) {
          return;
        }
        sVar17 = pNVar12[-1].ptr;
        pNVar12 = pNVar12 + -1;
        do {
          if ((sVar17 & 8) == 0) {
            uVar22 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar21._4_4_ = uVar22;
            auVar21._0_4_ = uVar22;
            auVar21._8_4_ = uVar22;
            auVar21._12_4_ = uVar22;
            auVar21._16_4_ = uVar22;
            auVar21._20_4_ = uVar22;
            auVar21._24_4_ = uVar22;
            auVar21._28_4_ = uVar22;
            uVar10 = sVar17 & 0xfffffffffffffff0;
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar13),auVar21,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar13));
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar14),auVar21,
                                     *(undefined1 (*) [32])(uVar10 + 0x40 + uVar14));
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar33,auVar31);
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar34,auVar32);
            auVar4 = vpmaxsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar3));
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + uVar15),auVar21,
                                      *(undefined1 (*) [32])(uVar10 + 0x40 + uVar15));
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar35,auVar30);
            auVar5 = vpmaxsd_avx2(ZEXT1632(auVar20),auVar36);
            auVar4 = vpmaxsd_avx2(auVar4,auVar5);
            auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar13 ^ 0x20)),
                                      auVar21,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar13 ^ 0x20)));
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar33,auVar31);
            auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar14 ^ 0x20)),
                                     auVar21,*(undefined1 (*) [32])(uVar10 + 0x40 + (uVar14 ^ 0x20))
                                    );
            auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar34,auVar32);
            auVar27 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar10 + 0x100 + (uVar15 ^ 0x20)),
                                      auVar21,*(undefined1 (*) [32])
                                               (uVar10 + 0x40 + (uVar15 ^ 0x20)));
            auVar5 = vpminsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar3));
            auVar20 = vfmadd213ps_fma(ZEXT1632(auVar27),auVar35,auVar30);
            auVar6 = vpminsd_avx2(ZEXT1632(auVar20),auVar37);
            auVar5 = vpminsd_avx2(auVar5,auVar6);
            auVar4 = vcmpps_avx(auVar4,auVar5,2);
            if (((uint)sVar17 & 7) == 6) {
              auVar5 = vcmpps_avx(*(undefined1 (*) [32])(uVar10 + 0x1c0),auVar21,2);
              auVar6 = vcmpps_avx(auVar21,*(undefined1 (*) [32])(uVar10 + 0x1e0),1);
              auVar5 = vandps_avx(auVar5,auVar6);
              auVar4 = vandps_avx(auVar5,auVar4);
              auVar20 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
            }
            else {
              auVar20 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
            }
            auVar20 = vpsllw_avx(auVar20,0xf);
            auVar20 = vpacksswb_avx(auVar20,auVar20);
            unaff_R14 = (ulong)(byte)(SUB161(auVar20 >> 7,0) & 1 |
                                      (SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar20 >> 0x3f,0) << 7);
          }
          if ((sVar17 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar18 = 4;
            }
            else {
              uVar16 = sVar17 & 0xfffffffffffffff0;
              lVar11 = 0;
              for (uVar10 = unaff_R14; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000)
              {
                lVar11 = lVar11 + 1;
              }
              iVar18 = 0;
              for (uVar10 = unaff_R14 - 1 & unaff_R14; sVar17 = *(size_t *)(uVar16 + lVar11 * 8),
                  uVar10 != 0; uVar10 = uVar10 - 1 & uVar10) {
                pNVar12->ptr = sVar17;
                pNVar12 = pNVar12 + 1;
                lVar11 = 0;
                for (uVar7 = uVar10; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
                  lVar11 = lVar11 + 1;
                }
              }
            }
          }
          else {
            iVar18 = 6;
          }
        } while (iVar18 == 0);
        if (iVar18 == 6) {
          uVar10 = (ulong)((uint)sVar17 & 0xf);
          bVar19 = uVar10 != 8;
          iVar18 = 0;
          if (bVar19) {
            prim = (Primitive *)(sVar17 & 0xfffffffffffffff0);
            bVar9 = InstanceArrayIntersector1MB::occluded(&pre,ray,context,prim);
            if (!bVar9) {
              uVar16 = 0;
              do {
                prim = prim + 1;
                iVar18 = 0;
                if (uVar10 - 9 == uVar16) goto LAB_005336ce;
                bVar19 = InstanceArrayIntersector1MB::occluded(&pre,ray,context,prim);
                uVar16 = uVar16 + 1;
              } while (!bVar19);
              bVar19 = uVar16 < uVar10 - 8;
            }
            iVar18 = 0;
            if (bVar19) {
              ray->tfar = -INFINITY;
              iVar18 = 3;
            }
          }
        }
LAB_005336ce:
      } while (iVar18 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }